

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_function_pool.cpp
# Opt level: O3

void multithreaded(vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                   *frame)

{
  uint8_t threshold;
  ThreadPool *pTVar1;
  pointer pIVar2;
  long lVar3;
  ulong uVar4;
  Image map;
  Image result;
  ImageTemplate<unsigned_char> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  ImageTemplate<unsigned_char> local_58;
  
  pTVar1 = ThreadPoolMonoid::instance();
  ThreadPool::resize(pTVar1,4);
  pIVar2 = (frame->
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_98,pIVar2->_width,pIVar2->_height,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&local_98,'\0');
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_58,local_98._width,local_98._height,'\x01','\x01');
  pIVar2 = (frame->
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(frame->
                         super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 3) *
                 -0x3333333333333333)) {
    uVar4 = 1;
    lVar3 = 0;
    do {
      Function_Pool::Subtract
                ((Image *)((long)&pIVar2[1]._vptr_ImageTemplate + lVar3),
                 (Image *)((long)&pIVar2->_vptr_ImageTemplate + lVar3),&local_58);
      Function_Pool::Histogram(&local_70,&local_58);
      threshold = Image_Function::GetThreshold(&local_70);
      if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (threshold != '\0') {
        Function_Pool::Threshold(&local_58,&local_58,threshold);
        Function_Pool::BitwiseOr(&local_98,&local_58,&local_98);
      }
      pIVar2 = (frame->
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (ulong)(((long)(frame->
                                    super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 3)
                            * -0x3333333333333333));
  }
  pTVar1 = ThreadPoolMonoid::instance();
  ThreadPool::stop(pTVar1);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  local_98._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_98);
  return;
}

Assistant:

void multithreaded( const std::vector < PenguinV_Image::Image > & frame )
{
    // okay we setup 4 thread in global thread pool
    ThreadPoolMonoid::instance().resize( 4 );

    // Prepare image map
    PenguinV_Image::Image map( frame.front().width(), frame.front().height() );
    map.fill( 0 );

    PenguinV_Image::Image result( map.width(), map.height() );

    // As you see the only difference in this loop is namespace name
    for( size_t i = 0; i + 1 < frame.size(); ++i ) {
        // subtract one image from another
        Function_Pool::Subtract( frame[i + 1], frame[i], result );

        // find optimal threshold
        uint8_t threshold = Image_Function::GetThreshold( Function_Pool::Histogram( result ) );

        if( threshold > 0 ) { // there is something more than just background!
            // threshold image
            Function_Pool::Threshold( result, result, threshold );
            // add result to the map
            Function_Pool::BitwiseOr( map, result, map );
        }
    }

    // here we have to save the image map but don't do this in the example

    // We stop all threads in thread pool
    ThreadPoolMonoid::instance().stop();
}